

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall md::Code::and_to_dx(Code *this,Param *from,DataRegister *to,Size size)

{
  uint16_t uVar1;
  int iVar2;
  short sVar3;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  iVar2 = (**(to->super_Register).super_Param._vptr_Param)(to);
  uVar1 = Param::getMXn(from);
  sVar3 = -0x3fc0;
  if (size != WORD) {
    sVar3 = (size == LONG | 0xff80) << 7;
  }
  add_word(this,sVar3 + uVar1 + (short)(iVar2 << 9));
  (*from->_vptr_Param[2])(&local_40,from);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return this;
}

Assistant:

Code& Code::and_to_dx(const Param& from, const DataRegister& to, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0xC000 + (to.getXn() << 9) + (size_code << 6) + from.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(from.getAdditionnalData());

    return *this;
}